

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragScalar(char *label,ImGuiDataType data_type,void *p_data,float v_speed,void *p_min,
                      void *p_max,char *format,ImGuiSliderFlags flags)

{
  float text_baseline_y;
  ImGuiWindow *this;
  ImVec2 IVar1;
  void *pvVar2;
  ImGuiContext *pIVar3;
  char *pcVar4;
  void *p_data_00;
  char *label_00;
  bool bVar5;
  byte bVar6;
  ImGuiID id;
  int iVar7;
  ImU32 fill_col;
  uint uVar8;
  ImGuiDataTypeInfo *pIVar9;
  uint uVar10;
  ulong uVar11;
  ImGuiCol idx;
  void *p_clamp_max;
  uint uVar12;
  bool bVar13;
  bool bVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar15;
  float fVar16;
  ImRect frame_bb;
  ImRect total_bb;
  char value_buf [64];
  ImRect local_f0;
  char *local_e0;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  char *local_c0;
  uint local_b4;
  uint local_b0;
  float local_ac;
  undefined1 local_a8 [16];
  ImVec2 local_90;
  ImRect local_88;
  char local_78 [72];
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  local_d8 = p_min;
  local_d0 = p_max;
  local_c8 = p_data;
  local_ac = v_speed;
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  local_a8._0_4_ = CalcItemWidth();
  local_a8._4_4_ = extraout_XMM0_Db;
  local_a8._8_4_ = extraout_XMM0_Dc;
  local_a8._12_4_ = extraout_XMM0_Dd;
  local_c0 = label;
  IVar1 = CalcTextSize(label,(char *)0x0,true,-1.0);
  text_baseline_y = (pIVar3->Style).FramePadding.y;
  local_f0.Max.x = (float)local_a8._0_4_ + (this->DC).CursorPos.x;
  fVar15 = text_baseline_y + text_baseline_y + IVar1.y + (this->DC).CursorPos.y;
  local_f0.Max.y = fVar15;
  local_f0.Min = (this->DC).CursorPos;
  fVar16 = 0.0;
  if (0.0 < IVar1.x) {
    fVar16 = (pIVar3->Style).ItemInnerSpacing.x + IVar1.x;
  }
  local_a8._8_4_ = extraout_XMM0_Dc_00;
  local_a8._0_4_ = IVar1.x;
  local_a8._4_4_ = IVar1.y;
  local_a8._12_4_ = extraout_XMM0_Dd_00;
  local_88.Max.y = fVar15 + 0.0;
  local_88.Max.x = fVar16 + local_f0.Max.x;
  uVar12 = flags & 0x80;
  local_88.Min = local_f0.Min;
  ItemSize(&local_88,text_baseline_y);
  uVar8 = uVar12 * 2 ^ 0x100;
  pIVar9 = (ImGuiDataTypeInfo *)(ulong)uVar8;
  bVar5 = ItemAdd(&local_88,id,&local_f0,uVar8);
  if (!bVar5) {
    return false;
  }
  if (format == (char *)0x0) {
    if (9 < (uint)data_type) {
      __assert_fail("data_type >= 0 && data_type < ImGuiDataType_COUNT",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                    ,0x77f,"const ImGuiDataTypeInfo *ImGui::DataTypeGetInfo(ImGuiDataType)");
    }
    pIVar9 = GDataTypeInfo;
    format = GDataTypeInfo[(uint)data_type].PrintFmt;
  }
  else if ((data_type == 4) && (iVar7 = strcmp(format,"%d"), iVar7 != 0)) {
    format = PatchFormatStringFloatToInt(format);
  }
  uVar11 = (ulong)id;
  bVar5 = ItemHoverable(&local_f0,id);
  if ((uVar12 == 0) && (GImGui->ActiveId == id)) {
    bVar13 = GImGui->TempInputId == id;
  }
  else {
    bVar13 = false;
  }
  local_e0 = format;
  if (!bVar13) {
    if (uVar12 == 0) {
      uVar8 = (uint)CONCAT71((int7)((ulong)pIVar9 >> 8),
                             *(undefined1 *)((long)&(pIVar3->LastItemData).StatusFlags + 1)) &
              0xffffff01;
    }
    else {
      uVar8 = 0;
    }
    if (bVar5) {
      uVar10 = (uint)CONCAT71((int7)(uVar11 >> 8),(pIVar3->IO).MouseClicked[0]);
      bVar14 = (pIVar3->IO).MouseClickedCount[0] == 2;
    }
    else {
      uVar10 = 0;
      bVar14 = false;
    }
    if (((((char)uVar8 != '\0' || (uVar10 & 1) != 0) || bVar14) || (pIVar3->NavActivateId == id)) ||
       (pIVar3->NavActivateInputId == id)) {
      local_b4 = uVar10;
      local_b0 = uVar8;
      SetActiveID(id,this);
      SetFocusID(id,this);
      FocusWindow(this);
      pIVar3->ActiveIdUsingNavDirMask = 3;
      if (uVar12 == 0) {
        if ((char)local_b0 == '\0') {
          if ((char)local_b4 == '\0') {
            if (!bVar14) goto LAB_00179c3b;
          }
          else if (!bVar14 && ((pIVar3->IO).KeyCtrl & 1U) == 0) {
LAB_00179c3b:
            if (pIVar3->NavActivateInputId != id) goto LAB_00179b8b;
          }
        }
        bVar13 = true;
      }
    }
LAB_00179b8b:
    if ((((!bVar13) && (uVar12 == 0)) &&
        (((pIVar3->IO).ConfigDragClickToInputText != false &&
         ((bVar5 && pIVar3->ActiveId == id && ((pIVar3->IO).MouseReleased[0] == true)))))) &&
       (bVar14 = IsMouseDragPastThreshold(0,(pIVar3->IO).MouseDragThreshold * 0.5), !bVar14)) {
      pIVar3->NavActivateInputId = id;
      pIVar3->NavActivateId = id;
      pIVar3->NavActivateFlags = 1;
      goto LAB_001798c6;
    }
  }
  if (!bVar13) {
    idx = 9;
    if (pIVar3->ActiveId != id) {
      idx = bVar5 + 7;
    }
    fill_col = GetColorU32(idx,1.0);
    RenderNavHighlight(&local_f0,id,1);
    RenderFrame(local_f0.Min,local_f0.Max,fill_col,true,(pIVar3->Style).FrameRounding);
    pvVar2 = local_c8;
    pcVar4 = local_e0;
    bVar5 = DragBehavior(id,data_type,local_c8,local_ac,local_d8,local_d0,local_e0,flags);
    if (bVar5) {
      MarkItemEdited(id);
    }
    iVar7 = DataTypeFormatString(local_78,0x40,data_type,pvVar2,pcVar4);
    pcVar4 = local_c0;
    if (pIVar3->LogEnabled == true) {
      LogSetNextTextDecoration("{","}");
    }
    local_90.x = 0.5;
    local_90.y = 0.5;
    RenderTextClipped(&local_f0.Min,&local_f0.Max,local_78,local_78 + iVar7,(ImVec2 *)0x0,&local_90,
                      (ImRect *)0x0);
    if (0.0 < (float)local_a8._0_4_) {
      IVar1.y = local_f0.Min.y + (pIVar3->Style).FramePadding.y;
      IVar1.x = local_f0.Max.x + (pIVar3->Style).ItemInnerSpacing.x;
      RenderText(IVar1,pcVar4,(char *)0x0,true);
      return bVar5;
    }
    return bVar5;
  }
LAB_001798c6:
  label_00 = local_c0;
  p_data_00 = local_c8;
  p_clamp_max = local_d0;
  pvVar2 = local_d8;
  pcVar4 = local_e0;
  if ((flags & 0x10U) == 0) {
    bVar6 = 0;
  }
  else {
    bVar6 = 1;
    if (local_d0 != (void *)0x0 && local_d8 != (void *)0x0) {
      iVar7 = DataTypeCompare(data_type,local_d8,local_d0);
      bVar6 = (byte)((uint)iVar7 >> 0x1f);
    }
  }
  if (bVar6 == 0) {
    p_clamp_max = (void *)0x0;
    pvVar2 = (void *)0x0;
  }
  bVar5 = TempInputScalar(&local_f0,id,label_00,data_type,p_data_00,pcVar4,pvVar2,p_clamp_max);
  return bVar5;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}